

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_compositions.h
# Opt level: O0

void __thiscall
icu_63::numparse::impl::ArraySeriesMatcher::~ArraySeriesMatcher(ArraySeriesMatcher *this)

{
  ArraySeriesMatcher *this_local;
  
  ~ArraySeriesMatcher(this);
  operator_delete(this);
  return;
}

Assistant:

class U_I18N_API ArraySeriesMatcher : public SeriesMatcher {
  public:
    ArraySeriesMatcher();  // WARNING: Leaves the object in an unusable state

    typedef MaybeStackArray<const NumberParseMatcher*, 3> MatcherArray;

    /** The array is std::move'd */
    ArraySeriesMatcher(MatcherArray& matchers, int32_t matchersLen);

    UnicodeString toString() const override;

    int32_t length() const override;

  protected:
    const NumberParseMatcher* const* begin() const override;

    const NumberParseMatcher* const* end() const override;

  private:
    MatcherArray fMatchers;
    int32_t fMatchersLen;
}